

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O1

ostream * Color::operator<<(ostream *os,Modifier *mod)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\x1b[",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,mod->code);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"m",1);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Modifier &mod) {
    return os << "\033[" << mod.code << "m";
  }